

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O0

int __thiscall BinNE<0,_4,_1>::checkSatisfied(BinNE<0,_4,_1> *this)

{
  char cVar1;
  bool bVar2;
  IntView<4> *this_00;
  int64_t iVar3;
  int64_t iVar4;
  long in_RDI;
  Tchar *unaff_retaddr;
  BoolView *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffffc;
  char o;
  
  o = (char)((uint)in_stack_fffffffffffffffc >> 0x18);
  cVar1 = Tchar::operator_cast_to_char((Tchar *)(in_RDI + 0x10));
  if (cVar1 != '\0') {
    return 1;
  }
  bVar2 = BoolView::isFalse(in_stack_ffffffffffffffe0);
  if (!bVar2) {
    this_00 = (IntView<4> *)IntView<0>::getMin((IntView<0> *)in_stack_ffffffffffffffe0);
    iVar3 = IntView<4>::getMax(this_00);
    if ((long)this_00 <= iVar3) {
      iVar3 = IntView<0>::getMax((IntView<0> *)this_00);
      iVar4 = IntView<4>::getMin(this_00);
      if (iVar4 <= iVar3) {
        return 3;
      }
    }
    Tchar::operator=(unaff_retaddr,o);
    return 3;
  }
  Tchar::operator=(unaff_retaddr,o);
  return 1;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (r.isFalse()) {
			satisfied = true;
			return 1;
		}
		if (x.getMin() > y.getMax() || x.getMax() < y.getMin()) {
			satisfied = true;
		}
		return 3;
	}